

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_averages_and_directions.cpp
# Opt level: O1

void compute_avgs_and_dirs_3_comp_rgb(partition_info *pi,image_block *blk,partition_metrics *pm)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  uint uVar7;
  uint8_t (*pauVar8) [216];
  uint i;
  ulong uVar9;
  ulong uVar10;
  uint i_3;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar19;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  undefined1 auVar17 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined4 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vfloat4 partition_averages [4];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 local_28 [32];
  
  uVar3 = pi->partition_count;
  if (uVar3 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x23e,
                  "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
                 );
  }
  bVar1 = blk->texel_count;
  uVar10 = (ulong)bVar1;
  if (bVar1 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x36,
                  "void compute_partition_averages_rgb(const partition_info &, const image_block &, vfloat4 *)"
                 );
  }
  if (uVar3 == 1) {
    local_98 = vblendps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])(blk->data_mean).m,7);
  }
  else {
    uVar7 = CONCAT31(0,bVar1);
    if (uVar3 == 2) {
      auVar42[4] = bVar1;
      auVar42._0_4_ = uVar7;
      auVar42._5_3_ = 0;
      auVar42[8] = bVar1;
      auVar42._9_3_ = 0;
      auVar42[0xc] = bVar1;
      auVar42._13_3_ = 0;
      auVar42[0x10] = bVar1;
      auVar42._17_3_ = 0;
      auVar42[0x14] = bVar1;
      auVar42._21_3_ = 0;
      auVar42[0x18] = bVar1;
      auVar42._25_3_ = 0;
      auVar42[0x1c] = bVar1;
      auVar42._29_3_ = 0;
      auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar72._8_4_ = 8;
      auVar72._0_8_ = 0x800000008;
      auVar72._12_4_ = 8;
      auVar72._16_4_ = 8;
      auVar72._20_4_ = 8;
      auVar72._24_4_ = 8;
      auVar72._28_4_ = 8;
      uVar9 = 0;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      auVar25 = ZEXT816(0);
      auVar57 = ZEXT816(0);
      do {
        auVar5 = vpcmpgtd_avx2(auVar42,auVar4);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)(pi->partition_of_texel + uVar9);
        auVar13 = vpcmpeqb_avx(auVar74,(undefined1  [16])0x0);
        auVar55 = vpmovsxbd_avx2(auVar13);
        auVar5 = vpand_avx2(auVar5,auVar55);
        auVar55 = vpand_avx2(auVar5,*(undefined1 (*) [32])(blk->data_r + uVar9));
        auVar4 = vpaddd_avx2(auVar4,auVar72);
        fVar56 = auVar57._4_4_;
        fVar18 = auVar57._8_4_;
        fVar19 = auVar57._12_4_;
        auVar57._0_4_ = auVar55._16_4_ + auVar55._0_4_ + auVar57._0_4_;
        auVar57._4_4_ = auVar55._20_4_ + auVar55._4_4_ + fVar56;
        auVar57._8_4_ = auVar55._24_4_ + auVar55._8_4_ + fVar18;
        auVar57._12_4_ = auVar55._28_4_ + auVar55._12_4_ + fVar19;
        auVar55 = vpand_avx2(auVar5,*(undefined1 (*) [32])(blk->data_g + uVar9));
        fVar56 = auVar25._4_4_;
        fVar18 = auVar25._8_4_;
        fVar19 = auVar25._12_4_;
        auVar25._0_4_ = auVar55._16_4_ + auVar55._0_4_ + auVar25._0_4_;
        auVar25._4_4_ = auVar55._20_4_ + auVar55._4_4_ + fVar56;
        auVar25._8_4_ = auVar55._24_4_ + auVar55._8_4_ + fVar18;
        auVar25._12_4_ = auVar55._28_4_ + auVar55._12_4_ + fVar19;
        auVar5 = vpand_avx2(auVar5,*(undefined1 (*) [32])(blk->data_b + uVar9));
        auVar13._0_4_ = auVar5._16_4_ + auVar17._0_4_ + auVar5._0_4_;
        auVar13._4_4_ = auVar5._20_4_ + auVar17._4_4_ + auVar5._4_4_;
        auVar13._8_4_ = auVar5._24_4_ + auVar17._8_4_ + auVar5._8_4_;
        auVar13._12_4_ = auVar5._28_4_ + auVar17._12_4_ + auVar5._12_4_;
        auVar17 = ZEXT1664(auVar13);
        uVar9 = uVar9 + 8;
      } while (uVar9 < uVar10);
      fVar56 = (float)uVar7;
      auVar14 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar74 = vshufpd_avx(auVar57,auVar57,1);
      auVar49._0_4_ = auVar57._0_4_ + auVar74._0_4_;
      auVar49._4_4_ = auVar57._4_4_ + auVar74._4_4_;
      auVar49._8_4_ = auVar57._8_4_ + auVar74._8_4_;
      auVar49._12_4_ = auVar57._12_4_ + auVar74._12_4_;
      auVar57 = vhaddps_avx(auVar49,auVar49);
      auVar74 = vshufpd_avx(auVar25,auVar25,1);
      auVar26._0_4_ = auVar25._0_4_ + auVar74._0_4_;
      auVar26._4_4_ = auVar25._4_4_ + auVar74._4_4_;
      auVar26._8_4_ = auVar25._8_4_ + auVar74._8_4_;
      auVar26._12_4_ = auVar25._12_4_ + auVar74._12_4_;
      auVar25 = vhaddps_avx(auVar26,auVar26);
      auVar38._0_4_ = fVar56 * auVar14._0_4_;
      auVar38._4_4_ = fVar56 * auVar14._4_4_;
      auVar38._8_4_ = fVar56 * auVar14._8_4_;
      auVar38._12_4_ = fVar56 * auVar14._12_4_;
      auVar57 = vinsertps_avx(auVar57,auVar25,0x1c);
      auVar25 = vshufpd_avx(auVar13,auVar13,1);
      auVar14._0_4_ = auVar13._0_4_ + auVar25._0_4_;
      auVar14._4_4_ = auVar13._4_4_ + auVar25._4_4_;
      auVar14._8_4_ = auVar13._8_4_ + auVar25._8_4_;
      auVar14._12_4_ = auVar13._12_4_ + auVar25._12_4_;
      auVar25 = vhaddps_avx(auVar14,auVar14);
      fVar56 = (float)pi->partition_texel_count[0];
      auVar25 = vblendps_avx(auVar57,auVar25,4);
      auVar27._4_4_ = fVar56;
      auVar27._0_4_ = fVar56;
      auVar27._8_4_ = fVar56;
      auVar27._12_4_ = fVar56;
      local_98 = vdivps_avx(auVar25,auVar27);
      auVar28._0_4_ = (float)pi->partition_texel_count[1];
      auVar25 = vsubps_avx(auVar38,auVar25);
      auVar28._4_4_ = auVar28._0_4_;
      auVar28._8_4_ = auVar28._0_4_;
      auVar28._12_4_ = auVar28._0_4_;
      local_88 = vdivps_avx(auVar25,auVar28);
    }
    else if (uVar3 == 3) {
      auVar55[4] = bVar1;
      auVar55._0_4_ = uVar7;
      auVar55._5_3_ = 0;
      auVar55[8] = bVar1;
      auVar55._9_3_ = 0;
      auVar55[0xc] = bVar1;
      auVar55._13_3_ = 0;
      auVar55[0x10] = bVar1;
      auVar55._17_3_ = 0;
      auVar55[0x14] = bVar1;
      auVar55._21_3_ = 0;
      auVar55[0x18] = bVar1;
      auVar55._25_3_ = 0;
      auVar55[0x1c] = bVar1;
      auVar55._29_3_ = 0;
      auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      uVar9 = 0;
      auVar76._8_4_ = 8;
      auVar76._0_8_ = 0x800000008;
      auVar76._12_4_ = 8;
      auVar76._16_4_ = 8;
      auVar76._20_4_ = 8;
      auVar76._24_4_ = 8;
      auVar76._28_4_ = 8;
      auVar77[8] = 1;
      auVar77._0_8_ = 0x101010101010101;
      auVar77[9] = 1;
      auVar77[10] = 1;
      auVar77[0xb] = 1;
      auVar77[0xc] = 1;
      auVar77[0xd] = 1;
      auVar77[0xe] = 1;
      auVar77[0xf] = 1;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      auVar20 = ZEXT816(0);
      auVar36 = ZEXT816(0);
      auVar43 = ZEXT816(0);
      auVar65 = ZEXT816(0);
      auVar79 = ZEXT816(0);
      do {
        auVar72 = vpcmpgtd_avx2(auVar55,auVar4);
        auVar4 = vpaddd_avx2(auVar76,auVar4);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = *(ulong *)(pi->partition_of_texel + uVar9);
        auVar25 = vpcmpeqb_avx(auVar82,(undefined1  [16])0x0);
        auVar42 = vpmovsxbd_avx2(auVar25);
        auVar42 = vpand_avx2(auVar42,auVar72);
        auVar25 = vpcmpeqb_avx(auVar82,auVar77);
        auVar5 = vpmovsxbd_avx2(auVar25);
        auVar72 = vpand_avx2(auVar5,auVar72);
        auVar5 = vpand_avx2(auVar42,*(undefined1 (*) [32])(blk->data_r + uVar9));
        fVar56 = auVar79._4_4_;
        fVar18 = auVar79._8_4_;
        fVar19 = auVar79._12_4_;
        auVar79._0_4_ = auVar5._16_4_ + auVar79._0_4_ + auVar5._0_4_;
        auVar79._4_4_ = auVar5._20_4_ + fVar56 + auVar5._4_4_;
        auVar79._8_4_ = auVar5._24_4_ + fVar18 + auVar5._8_4_;
        auVar79._12_4_ = auVar5._28_4_ + fVar19 + auVar5._12_4_;
        auVar5 = vpand_avx2(auVar72,*(undefined1 (*) [32])(blk->data_r + uVar9));
        fVar56 = auVar36._4_4_;
        fVar18 = auVar36._8_4_;
        fVar19 = auVar36._12_4_;
        auVar36._0_4_ = auVar5._16_4_ + auVar5._0_4_ + auVar36._0_4_;
        auVar36._4_4_ = auVar5._20_4_ + auVar5._4_4_ + fVar56;
        auVar36._8_4_ = auVar5._24_4_ + auVar5._8_4_ + fVar18;
        auVar36._12_4_ = auVar5._28_4_ + auVar5._12_4_ + fVar19;
        auVar5 = vpand_avx2(auVar42,*(undefined1 (*) [32])(blk->data_g + uVar9));
        fVar56 = auVar65._4_4_;
        fVar18 = auVar65._8_4_;
        fVar19 = auVar65._12_4_;
        auVar65._0_4_ = auVar5._16_4_ + auVar5._0_4_ + auVar65._0_4_;
        auVar65._4_4_ = auVar5._20_4_ + auVar5._4_4_ + fVar56;
        auVar65._8_4_ = auVar5._24_4_ + auVar5._8_4_ + fVar18;
        auVar65._12_4_ = auVar5._28_4_ + auVar5._12_4_ + fVar19;
        auVar5 = vpand_avx2(auVar72,*(undefined1 (*) [32])(blk->data_g + uVar9));
        fVar56 = auVar20._4_4_;
        fVar18 = auVar20._8_4_;
        fVar19 = auVar20._12_4_;
        auVar20._0_4_ = auVar5._16_4_ + auVar5._0_4_ + auVar20._0_4_;
        auVar20._4_4_ = auVar5._20_4_ + auVar5._4_4_ + fVar56;
        auVar20._8_4_ = auVar5._24_4_ + auVar5._8_4_ + fVar18;
        auVar20._12_4_ = auVar5._28_4_ + auVar5._12_4_ + fVar19;
        auVar42 = vpand_avx2(auVar42,*(undefined1 (*) [32])(blk->data_b + uVar9));
        fVar56 = auVar43._4_4_;
        fVar18 = auVar43._8_4_;
        fVar19 = auVar43._12_4_;
        auVar43._0_4_ = auVar42._16_4_ + auVar42._0_4_ + auVar43._0_4_;
        auVar43._4_4_ = auVar42._20_4_ + auVar42._4_4_ + fVar56;
        auVar43._8_4_ = auVar42._24_4_ + auVar42._8_4_ + fVar18;
        auVar43._12_4_ = auVar42._28_4_ + auVar42._12_4_ + fVar19;
        auVar42 = vpand_avx2(auVar72,*(undefined1 (*) [32])(blk->data_b + uVar9));
        auVar11._0_4_ = auVar42._16_4_ + auVar42._0_4_ + auVar17._0_4_;
        auVar11._4_4_ = auVar42._20_4_ + auVar42._4_4_ + auVar17._4_4_;
        auVar11._8_4_ = auVar42._24_4_ + auVar42._8_4_ + auVar17._8_4_;
        auVar11._12_4_ = auVar42._28_4_ + auVar42._12_4_ + auVar17._12_4_;
        auVar17 = ZEXT1664(auVar11);
        uVar9 = uVar9 + 8;
      } while (uVar9 < uVar10);
      fVar56 = (float)uVar7;
      auVar25 = vshufpd_avx(auVar79,auVar79,1);
      auVar73._0_4_ = auVar79._0_4_ + auVar25._0_4_;
      auVar73._4_4_ = auVar79._4_4_ + auVar25._4_4_;
      auVar73._8_4_ = auVar79._8_4_ + auVar25._8_4_;
      auVar73._12_4_ = auVar79._12_4_ + auVar25._12_4_;
      auVar25 = vhaddps_avx(auVar73,auVar73);
      auVar74 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar57 = vshufpd_avx(auVar65,auVar65,1);
      auVar66._0_4_ = auVar57._0_4_ + auVar65._0_4_;
      auVar66._4_4_ = auVar57._4_4_ + auVar65._4_4_;
      auVar66._8_4_ = auVar57._8_4_ + auVar65._8_4_;
      auVar66._12_4_ = auVar57._12_4_ + auVar65._12_4_;
      auVar57 = vhaddps_avx(auVar66,auVar66);
      auVar13 = vshufpd_avx(auVar43,auVar43,1);
      auVar44._0_4_ = auVar13._0_4_ + auVar43._0_4_;
      auVar44._4_4_ = auVar13._4_4_ + auVar43._4_4_;
      auVar44._8_4_ = auVar13._8_4_ + auVar43._8_4_;
      auVar44._12_4_ = auVar13._12_4_ + auVar43._12_4_;
      auVar13 = vhaddps_avx(auVar44,auVar44);
      auVar48._0_4_ = fVar56 * auVar74._0_4_;
      auVar48._4_4_ = fVar56 * auVar74._4_4_;
      auVar48._8_4_ = fVar56 * auVar74._8_4_;
      auVar48._12_4_ = fVar56 * auVar74._12_4_;
      auVar74 = vshufpd_avx(auVar36,auVar36,1);
      auVar37._0_4_ = auVar36._0_4_ + auVar74._0_4_;
      auVar37._4_4_ = auVar36._4_4_ + auVar74._4_4_;
      auVar37._8_4_ = auVar36._8_4_ + auVar74._8_4_;
      auVar37._12_4_ = auVar36._12_4_ + auVar74._12_4_;
      auVar74 = vhaddps_avx(auVar37,auVar37);
      auVar14 = vshufpd_avx(auVar20,auVar20,1);
      auVar21._0_4_ = auVar20._0_4_ + auVar14._0_4_;
      auVar21._4_4_ = auVar20._4_4_ + auVar14._4_4_;
      auVar21._8_4_ = auVar20._8_4_ + auVar14._8_4_;
      auVar21._12_4_ = auVar20._12_4_ + auVar14._12_4_;
      auVar14 = vhaddps_avx(auVar21,auVar21);
      auVar25 = vinsertps_avx(auVar25,auVar57,0x1c);
      auVar25 = vblendps_avx(auVar25,auVar13,4);
      auVar13 = vinsertps_avx(auVar74,auVar14,0x1c);
      auVar57 = vshufpd_avx(auVar11,auVar11,1);
      auVar12._0_4_ = auVar11._0_4_ + auVar57._0_4_;
      auVar12._4_4_ = auVar11._4_4_ + auVar57._4_4_;
      auVar12._8_4_ = auVar11._8_4_ + auVar57._8_4_;
      auVar12._12_4_ = auVar11._12_4_ + auVar57._12_4_;
      auVar57 = vhaddps_avx(auVar12,auVar12);
      fVar56 = (float)pi->partition_texel_count[0];
      auVar57 = vblendps_avx(auVar13,auVar57,4);
      auVar22._4_4_ = fVar56;
      auVar22._0_4_ = fVar56;
      auVar22._8_4_ = fVar56;
      auVar22._12_4_ = fVar56;
      local_98 = vdivps_avx(auVar25,auVar22);
      auVar23._0_4_ = (float)pi->partition_texel_count[1];
      auVar25 = vsubps_avx(auVar48,auVar25);
      auVar23._4_4_ = auVar23._0_4_;
      auVar23._8_4_ = auVar23._0_4_;
      auVar23._12_4_ = auVar23._0_4_;
      local_88 = vdivps_avx(auVar57,auVar23);
      auVar24._0_4_ = (float)pi->partition_texel_count[2];
      auVar25 = vsubps_avx(auVar25,auVar57);
      auVar24._4_4_ = auVar24._0_4_;
      auVar24._8_4_ = auVar24._0_4_;
      auVar24._12_4_ = auVar24._0_4_;
      local_78 = vdivps_avx(auVar25,auVar24);
    }
    else {
      local_28[4] = bVar1;
      local_28._0_4_ = uVar7;
      local_28._5_3_ = 0;
      local_28[8] = bVar1;
      local_28._9_3_ = 0;
      local_28[0xc] = bVar1;
      local_28._13_3_ = 0;
      local_28[0x10] = bVar1;
      local_28._17_3_ = 0;
      local_28[0x14] = bVar1;
      local_28._21_3_ = 0;
      local_28[0x18] = bVar1;
      local_28._25_3_ = 0;
      local_28[0x1c] = bVar1;
      local_28._29_3_ = 0;
      auVar4 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      local_48 = 8;
      uStack_44 = 8;
      uStack_40 = 8;
      uStack_3c = 8;
      uStack_38 = 8;
      uStack_34 = 8;
      uStack_30 = 8;
      uStack_2c = 8;
      local_58 = 1;
      uStack_57 = 1;
      uStack_56 = 1;
      uStack_55 = 1;
      uStack_54 = 1;
      uStack_53 = 1;
      uStack_52 = 1;
      uStack_51 = 1;
      uStack_50 = 1;
      uStack_4f = 1;
      uStack_4e = 1;
      uStack_4d = 1;
      uStack_4c = 1;
      uStack_4b = 1;
      uStack_4a = 1;
      uStack_49 = 1;
      uVar9 = 0;
      auVar84[8] = 2;
      auVar84._0_8_ = 0x202020202020202;
      auVar84[9] = 2;
      auVar84[10] = 2;
      auVar84[0xb] = 2;
      auVar84[0xc] = 2;
      auVar84[0xd] = 2;
      auVar84[0xe] = 2;
      auVar84[0xf] = 2;
      auVar83 = ZEXT816(0) << 0x40;
      auVar80 = ZEXT816(0);
      auVar67 = ZEXT816(0);
      auVar58 = ZEXT816(0);
      auVar50 = ZEXT816(0) << 0x40;
      auVar45 = ZEXT816(0);
      auVar39 = ZEXT816(0);
      auVar29 = ZEXT816(0);
      auVar15 = (undefined1  [16])0x0;
      do {
        auVar42 = vpcmpgtd_avx2(local_28,auVar4);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = *(ulong *)(pi->partition_of_texel + uVar9);
        auVar25 = vpcmpeqb_avx(auVar85,_DAT_0027d060);
        auVar72 = vpmovsxbd_avx2(auVar25);
        auVar72 = vpand_avx2(auVar42,auVar72);
        auVar6[8] = 1;
        auVar6._0_8_ = 0x101010101010101;
        auVar6[9] = 1;
        auVar6[10] = 1;
        auVar6[0xb] = 1;
        auVar6[0xc] = 1;
        auVar6[0xd] = 1;
        auVar6[0xe] = 1;
        auVar6[0xf] = 1;
        auVar25 = vpcmpeqb_avx(auVar85,auVar6);
        auVar5 = vpmovsxbd_avx2(auVar25);
        auVar5 = vpand_avx2(auVar5,auVar42);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)(pi->partition_of_texel + uVar9);
        auVar25 = vpcmpeqb_avx(auVar86,auVar84);
        auVar55 = vpmovsxbd_avx2(auVar25);
        auVar55 = vpand_avx2(auVar55,auVar42);
        auVar42 = *(undefined1 (*) [32])(blk->data_r + uVar9);
        auVar76 = vpand_avx2(auVar42,auVar72);
        fVar56 = auVar83._4_4_;
        fVar18 = auVar83._8_4_;
        fVar19 = auVar83._12_4_;
        auVar83._0_4_ = auVar76._16_4_ + auVar83._0_4_ + auVar76._0_4_;
        auVar83._4_4_ = auVar76._20_4_ + fVar56 + auVar76._4_4_;
        auVar83._8_4_ = auVar76._24_4_ + fVar18 + auVar76._8_4_;
        auVar83._12_4_ = auVar76._28_4_ + fVar19 + auVar76._12_4_;
        auVar76 = vpand_avx2(auVar5,auVar42);
        fVar56 = auVar58._4_4_;
        fVar18 = auVar58._8_4_;
        fVar19 = auVar58._12_4_;
        auVar58._0_4_ = auVar76._16_4_ + auVar76._0_4_ + auVar58._0_4_;
        auVar58._4_4_ = auVar76._20_4_ + auVar76._4_4_ + fVar56;
        auVar58._8_4_ = auVar76._24_4_ + auVar76._8_4_ + fVar18;
        auVar58._12_4_ = auVar76._28_4_ + auVar76._12_4_ + fVar19;
        auVar42 = vpand_avx2(auVar55,auVar42);
        fVar56 = auVar39._4_4_;
        fVar18 = auVar39._8_4_;
        fVar19 = auVar39._12_4_;
        auVar39._0_4_ = auVar42._16_4_ + auVar42._0_4_ + auVar39._0_4_;
        auVar39._4_4_ = auVar42._20_4_ + auVar42._4_4_ + fVar56;
        auVar39._8_4_ = auVar42._24_4_ + auVar42._8_4_ + fVar18;
        auVar39._12_4_ = auVar42._28_4_ + auVar42._12_4_ + fVar19;
        auVar42 = *(undefined1 (*) [32])(blk->data_g + uVar9);
        auVar76 = vpand_avx2(auVar42,auVar72);
        fVar56 = auVar80._4_4_;
        fVar18 = auVar80._8_4_;
        fVar19 = auVar80._12_4_;
        auVar80._0_4_ = auVar76._16_4_ + auVar80._0_4_ + auVar76._0_4_;
        auVar80._4_4_ = auVar76._20_4_ + fVar56 + auVar76._4_4_;
        auVar80._8_4_ = auVar76._24_4_ + fVar18 + auVar76._8_4_;
        auVar80._12_4_ = auVar76._28_4_ + fVar19 + auVar76._12_4_;
        auVar76 = vpand_avx2(auVar5,auVar42);
        fVar56 = auVar50._4_4_;
        fVar18 = auVar50._8_4_;
        fVar19 = auVar50._12_4_;
        auVar50._0_4_ = auVar76._16_4_ + auVar76._0_4_ + auVar50._0_4_;
        auVar50._4_4_ = auVar76._20_4_ + auVar76._4_4_ + fVar56;
        auVar50._8_4_ = auVar76._24_4_ + auVar76._8_4_ + fVar18;
        auVar50._12_4_ = auVar76._28_4_ + auVar76._12_4_ + fVar19;
        auVar42 = vpand_avx2(auVar55,auVar42);
        fVar56 = auVar29._4_4_;
        fVar18 = auVar29._8_4_;
        fVar19 = auVar29._12_4_;
        auVar29._0_4_ = auVar42._16_4_ + auVar42._0_4_ + auVar29._0_4_;
        auVar29._4_4_ = auVar42._20_4_ + auVar42._4_4_ + fVar56;
        auVar29._8_4_ = auVar42._24_4_ + auVar42._8_4_ + fVar18;
        auVar29._12_4_ = auVar42._28_4_ + auVar42._12_4_ + fVar19;
        auVar42 = *(undefined1 (*) [32])(blk->data_b + uVar9);
        auVar72 = vpand_avx2(auVar42,auVar72);
        fVar56 = auVar67._4_4_;
        fVar18 = auVar67._8_4_;
        fVar19 = auVar67._12_4_;
        auVar67._0_4_ = auVar72._16_4_ + auVar67._0_4_ + auVar72._0_4_;
        auVar67._4_4_ = auVar72._20_4_ + fVar56 + auVar72._4_4_;
        auVar67._8_4_ = auVar72._24_4_ + fVar18 + auVar72._8_4_;
        auVar67._12_4_ = auVar72._28_4_ + fVar19 + auVar72._12_4_;
        auVar72 = vpand_avx2(auVar5,auVar42);
        fVar56 = auVar45._4_4_;
        fVar18 = auVar45._8_4_;
        fVar19 = auVar45._12_4_;
        auVar45._0_4_ = auVar72._16_4_ + auVar45._0_4_ + auVar72._0_4_;
        auVar45._4_4_ = auVar72._20_4_ + fVar56 + auVar72._4_4_;
        auVar45._8_4_ = auVar72._24_4_ + fVar18 + auVar72._8_4_;
        auVar45._12_4_ = auVar72._28_4_ + fVar19 + auVar72._12_4_;
        auVar42 = vpand_avx2(auVar55,auVar42);
        fVar56 = auVar15._4_4_;
        fVar18 = auVar15._8_4_;
        fVar19 = auVar15._12_4_;
        auVar15._0_4_ = auVar42._16_4_ + auVar15._0_4_ + auVar42._0_4_;
        auVar15._4_4_ = auVar42._20_4_ + fVar56 + auVar42._4_4_;
        auVar15._8_4_ = auVar42._24_4_ + fVar18 + auVar42._8_4_;
        auVar15._12_4_ = auVar42._28_4_ + fVar19 + auVar42._12_4_;
        auVar5._8_4_ = 8;
        auVar5._0_8_ = 0x800000008;
        auVar5._12_4_ = 8;
        auVar5._16_4_ = 8;
        auVar5._20_4_ = 8;
        auVar5._24_4_ = 8;
        auVar5._28_4_ = 8;
        auVar4 = vpaddd_avx2(auVar4,auVar5);
        uVar9 = uVar9 + 8;
      } while (uVar9 < uVar10);
      fVar56 = (float)uVar7;
      auVar25 = vshufpd_avx(auVar83,auVar83,1);
      auVar78._0_4_ = auVar83._0_4_ + auVar25._0_4_;
      auVar78._4_4_ = auVar83._4_4_ + auVar25._4_4_;
      auVar78._8_4_ = auVar83._8_4_ + auVar25._8_4_;
      auVar78._12_4_ = auVar83._12_4_ + auVar25._12_4_;
      auVar25 = vhaddps_avx(auVar78,auVar78);
      auVar57 = vshufpd_avx(auVar80,auVar80,1);
      auVar81._0_4_ = auVar80._0_4_ + auVar57._0_4_;
      auVar81._4_4_ = auVar80._4_4_ + auVar57._4_4_;
      auVar81._8_4_ = auVar80._8_4_ + auVar57._8_4_;
      auVar81._12_4_ = auVar80._12_4_ + auVar57._12_4_;
      auVar57 = vhaddps_avx(auVar81,auVar81);
      auVar14 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar13 = vshufpd_avx(auVar67,auVar67,1);
      auVar68._0_4_ = auVar13._0_4_ + auVar67._0_4_;
      auVar68._4_4_ = auVar13._4_4_ + auVar67._4_4_;
      auVar68._8_4_ = auVar13._8_4_ + auVar67._8_4_;
      auVar68._12_4_ = auVar13._12_4_ + auVar67._12_4_;
      auVar13 = vhaddps_avx(auVar68,auVar68);
      auVar74 = vshufpd_avx(auVar58,auVar58,1);
      auVar59._0_4_ = auVar74._0_4_ + auVar58._0_4_;
      auVar59._4_4_ = auVar74._4_4_ + auVar58._4_4_;
      auVar59._8_4_ = auVar74._8_4_ + auVar58._8_4_;
      auVar59._12_4_ = auVar74._12_4_ + auVar58._12_4_;
      auVar74 = vhaddps_avx(auVar59,auVar59);
      auVar60._0_4_ = auVar14._0_4_ * fVar56;
      auVar60._4_4_ = auVar14._4_4_ * fVar56;
      auVar60._8_4_ = auVar14._8_4_ * fVar56;
      auVar60._12_4_ = auVar14._12_4_ * fVar56;
      auVar14 = vshufpd_avx(auVar50,auVar50,1);
      auVar51._0_4_ = auVar50._0_4_ + auVar14._0_4_;
      auVar51._4_4_ = auVar50._4_4_ + auVar14._4_4_;
      auVar51._8_4_ = auVar50._8_4_ + auVar14._8_4_;
      auVar51._12_4_ = auVar50._12_4_ + auVar14._12_4_;
      auVar14 = vhaddps_avx(auVar51,auVar51);
      auVar26 = vshufpd_avx(auVar45,auVar45,1);
      auVar46._0_4_ = auVar45._0_4_ + auVar26._0_4_;
      auVar46._4_4_ = auVar45._4_4_ + auVar26._4_4_;
      auVar46._8_4_ = auVar45._8_4_ + auVar26._8_4_;
      auVar46._12_4_ = auVar45._12_4_ + auVar26._12_4_;
      auVar26 = vhaddps_avx(auVar46,auVar46);
      auVar25 = vinsertps_avx(auVar25,auVar57,0x1c);
      auVar25 = vblendps_avx(auVar25,auVar13,4);
      auVar57 = vshufpd_avx(auVar39,auVar39,1);
      auVar40._0_4_ = auVar39._0_4_ + auVar57._0_4_;
      auVar40._4_4_ = auVar39._4_4_ + auVar57._4_4_;
      auVar40._8_4_ = auVar39._8_4_ + auVar57._8_4_;
      auVar40._12_4_ = auVar39._12_4_ + auVar57._12_4_;
      auVar13 = vhaddps_avx(auVar40,auVar40);
      auVar57 = vshufpd_avx(auVar29,auVar29,1);
      auVar30._0_4_ = auVar29._0_4_ + auVar57._0_4_;
      auVar30._4_4_ = auVar29._4_4_ + auVar57._4_4_;
      auVar30._8_4_ = auVar29._8_4_ + auVar57._8_4_;
      auVar30._12_4_ = auVar29._12_4_ + auVar57._12_4_;
      auVar27 = vhaddps_avx(auVar30,auVar30);
      auVar57 = vinsertps_avx(auVar74,auVar14,0x1c);
      auVar57 = vblendps_avx(auVar57,auVar26,4);
      auVar74 = vinsertps_avx(auVar13,auVar27,0x1c);
      auVar13 = vshufpd_avx(auVar15,auVar15,1);
      auVar16._0_4_ = auVar15._0_4_ + auVar13._0_4_;
      auVar16._4_4_ = auVar15._4_4_ + auVar13._4_4_;
      auVar16._8_4_ = auVar15._8_4_ + auVar13._8_4_;
      auVar16._12_4_ = auVar15._12_4_ + auVar13._12_4_;
      auVar13 = vhaddps_avx(auVar16,auVar16);
      fVar56 = (float)pi->partition_texel_count[0];
      auVar13 = vblendps_avx(auVar74,auVar13,4);
      auVar31._4_4_ = fVar56;
      auVar31._0_4_ = fVar56;
      auVar31._8_4_ = fVar56;
      auVar31._12_4_ = fVar56;
      local_98 = vdivps_avx(auVar25,auVar31);
      auVar32._0_4_ = (float)pi->partition_texel_count[1];
      auVar25 = vsubps_avx(auVar60,auVar25);
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = auVar32._0_4_;
      auVar32._12_4_ = auVar32._0_4_;
      local_88 = vdivps_avx(auVar57,auVar32);
      auVar33._0_4_ = (float)pi->partition_texel_count[2];
      auVar25 = vsubps_avx(auVar25,auVar57);
      auVar33._4_4_ = auVar33._0_4_;
      auVar33._8_4_ = auVar33._0_4_;
      auVar33._12_4_ = auVar33._0_4_;
      local_78 = vdivps_avx(auVar13,auVar33);
      auVar34._0_4_ = (float)pi->partition_texel_count[3];
      auVar25 = vsubps_avx(auVar25,auVar13);
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      local_68 = vdivps_avx(auVar25,auVar34);
    }
  }
  pauVar8 = pi->texels_of_partition;
  uVar10 = 0;
  do {
    bVar1 = pi->partition_texel_count[uVar10];
    if ((ulong)bVar1 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                    ,0x248,
                    "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
                   );
    }
    auVar25 = *(undefined1 (*) [16])(local_98 + uVar10 * 0x10);
    *(undefined1 (*) [16])pm[uVar10].avg.m = auVar25;
    uVar9 = 0;
    auVar57 = ZEXT816(0) << 0x40;
    auVar13 = ZEXT816(0) << 0x40;
    auVar74 = ZEXT816(0) << 0x40;
    do {
      bVar2 = (*pauVar8)[uVar9];
      auVar14 = vinsertps_avx(ZEXT416((uint)blk->data_r[bVar2]),ZEXT416((uint)blk->data_g[bVar2]),
                              0x1c);
      auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)blk->data_b[bVar2]),0x28);
      auVar27 = vsubps_avx(auVar14,auVar25);
      auVar26 = vcmpps_avx(ZEXT816(0) << 0x40,auVar27,1);
      uVar64 = auVar26._0_4_;
      auVar75._4_4_ = uVar64;
      auVar75._0_4_ = uVar64;
      auVar75._8_4_ = uVar64;
      auVar75._12_4_ = uVar64;
      auVar14 = vandps_avx(auVar75,auVar27);
      auVar35._0_4_ = auVar57._0_4_ + auVar14._0_4_;
      auVar35._4_4_ = auVar57._4_4_ + auVar14._4_4_;
      auVar35._8_4_ = auVar57._8_4_ + auVar14._8_4_;
      auVar35._12_4_ = auVar57._12_4_ + auVar14._12_4_;
      auVar57 = vshufps_avx(auVar26,auVar26,0x55);
      auVar57 = vandps_avx(auVar57,auVar27);
      auVar47._0_4_ = auVar13._0_4_ + auVar57._0_4_;
      auVar47._4_4_ = auVar13._4_4_ + auVar57._4_4_;
      auVar47._8_4_ = auVar13._8_4_ + auVar57._8_4_;
      auVar47._12_4_ = auVar13._12_4_ + auVar57._12_4_;
      auVar57 = vshufps_avx(auVar26,auVar26,0xaa);
      auVar57 = vandps_avx(auVar57,auVar27);
      auVar41._0_4_ = auVar74._0_4_ + auVar57._0_4_;
      auVar41._4_4_ = auVar74._4_4_ + auVar57._4_4_;
      auVar41._8_4_ = auVar74._8_4_ + auVar57._8_4_;
      auVar41._12_4_ = auVar74._12_4_ + auVar57._12_4_;
      uVar9 = uVar9 + 1;
      auVar57 = auVar35;
      auVar13 = auVar47;
      auVar74 = auVar41;
    } while (bVar1 != uVar9);
    auVar52._0_4_ = auVar35._0_4_ * auVar35._0_4_;
    auVar52._4_4_ = auVar35._4_4_ * auVar35._4_4_;
    auVar52._8_4_ = auVar35._8_4_ * auVar35._8_4_;
    auVar52._12_4_ = auVar35._12_4_ * auVar35._12_4_;
    auVar25 = vshufpd_avx(auVar52,auVar52,1);
    auVar53._0_4_ = auVar52._0_4_ + auVar25._0_4_;
    auVar53._4_4_ = auVar52._4_4_ + auVar25._4_4_;
    auVar53._8_4_ = auVar52._8_4_ + auVar25._8_4_;
    auVar53._12_4_ = auVar52._12_4_ + auVar25._12_4_;
    auVar25 = vhaddps_avx(auVar53,auVar53);
    auVar61._0_4_ = auVar47._0_4_ * auVar47._0_4_;
    auVar61._4_4_ = auVar47._4_4_ * auVar47._4_4_;
    auVar61._8_4_ = auVar47._8_4_ * auVar47._8_4_;
    auVar61._12_4_ = auVar47._12_4_ * auVar47._12_4_;
    auVar57 = vshufpd_avx(auVar61,auVar61,1);
    auVar62._0_4_ = auVar61._0_4_ + auVar57._0_4_;
    auVar62._4_4_ = auVar61._4_4_ + auVar57._4_4_;
    auVar62._8_4_ = auVar61._8_4_ + auVar57._8_4_;
    auVar62._12_4_ = auVar61._12_4_ + auVar57._12_4_;
    auVar57 = vhaddps_avx(auVar62,auVar62);
    auVar54._0_4_ = auVar25._0_4_;
    auVar54._4_4_ = auVar54._0_4_;
    auVar54._8_4_ = auVar54._0_4_;
    auVar54._12_4_ = auVar54._0_4_;
    auVar63._0_4_ = auVar57._0_4_;
    auVar63._4_4_ = auVar63._0_4_;
    auVar63._8_4_ = auVar63._0_4_;
    auVar63._12_4_ = auVar63._0_4_;
    auVar69._0_4_ = auVar41._0_4_ * auVar41._0_4_;
    auVar69._4_4_ = auVar41._4_4_ * auVar41._4_4_;
    auVar69._8_4_ = auVar41._8_4_ * auVar41._8_4_;
    auVar69._12_4_ = auVar41._12_4_ * auVar41._12_4_;
    auVar25 = vshufpd_avx(auVar69,auVar69,1);
    auVar70._0_4_ = auVar69._0_4_ + auVar25._0_4_;
    auVar70._4_4_ = auVar69._4_4_ + auVar25._4_4_;
    auVar70._8_4_ = auVar69._8_4_ + auVar25._8_4_;
    auVar70._12_4_ = auVar69._12_4_ + auVar25._12_4_;
    auVar25 = vhaddps_avx(auVar70,auVar70);
    auVar71._0_4_ = auVar25._0_4_;
    auVar71._4_4_ = auVar71._0_4_;
    auVar71._8_4_ = auVar71._0_4_;
    auVar71._12_4_ = auVar71._0_4_;
    auVar25 = vcmpps_avx(auVar54,auVar63,1);
    auVar25 = vblendvps_avx(auVar35,auVar47,auVar25);
    auVar57 = vmaxps_avx(auVar63,auVar54);
    auVar57 = vcmpps_avx(auVar57,auVar71,1);
    auVar25 = vblendvps_avx(auVar25,auVar41,auVar57);
    *(undefined1 (*) [16])pm[uVar10].dir.m = auVar25;
    uVar10 = uVar10 + 1;
    pauVar8 = pauVar8 + 1;
  } while (uVar10 != (ushort)(uVar3 + (uVar3 == 0)));
  return;
}

Assistant:

void compute_avgs_and_dirs_3_comp_rgb(
	const partition_info& pi,
	const image_block& blk,
	partition_metrics pm[BLOCK_MAX_PARTITIONS]
) {
	unsigned int partition_count = pi.partition_count;
	promise(partition_count > 0);

	// Pre-compute partition_averages
	vfloat4 partition_averages[BLOCK_MAX_PARTITIONS];
	compute_partition_averages_rgb(pi, blk, partition_averages);

	for (unsigned int partition = 0; partition < partition_count; partition++)
	{
		const uint8_t *texel_indexes = pi.texels_of_partition[partition];
		unsigned int texel_count = pi.partition_texel_count[partition];
		promise(texel_count > 0);

		vfloat4 average = partition_averages[partition];
		pm[partition].avg = average;

		vfloat4 sum_xp = vfloat4::zero();
		vfloat4 sum_yp = vfloat4::zero();
		vfloat4 sum_zp = vfloat4::zero();

		for (unsigned int i = 0; i < texel_count; i++)
		{
			unsigned int iwt = texel_indexes[i];

			vfloat4 texel_datum = blk.texel3(iwt);
			texel_datum = texel_datum - average;

			vfloat4 zero = vfloat4::zero();

			vmask4 tdm0 = texel_datum.swz<0,0,0,0>() > zero;
			sum_xp += select(zero, texel_datum, tdm0);

			vmask4 tdm1 = texel_datum.swz<1,1,1,1>() > zero;
			sum_yp += select(zero, texel_datum, tdm1);

			vmask4 tdm2 = texel_datum.swz<2,2,2,2>() > zero;
			sum_zp += select(zero, texel_datum, tdm2);
		}

		vfloat4 prod_xp = dot(sum_xp, sum_xp);
		vfloat4 prod_yp = dot(sum_yp, sum_yp);
		vfloat4 prod_zp = dot(sum_zp, sum_zp);

		vfloat4 best_vector = sum_xp;
		vfloat4 best_sum = prod_xp;

		vmask4 mask = prod_yp > best_sum;
		best_vector = select(best_vector, sum_yp, mask);
		best_sum = select(best_sum, prod_yp, mask);

		mask = prod_zp > best_sum;
		best_vector = select(best_vector, sum_zp, mask);

		pm[partition].dir = best_vector;
	}
}